

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  int iVar1;
  cTValue *pcVar2;
  cTValue *pcVar3;
  cTValue *in_RCX;
  cTValue *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  uint in_R8D;
  uint64_t uVar4;
  cTValue *mo;
  cTValue *c;
  cTValue *b;
  TValue tempc;
  TValue tempb;
  MMS mm;
  cTValue *in_stack_ffffffffffffffa8;
  MMS in_stack_ffffffffffffffcc;
  TValue *local_8;
  
  iVar1 = (int)(uint)lj_bc_mode[in_R8D] >> 0xb;
  pcVar2 = str2num(in_stack_ffffffffffffffa8,(TValue *)0x10f714);
  if ((pcVar2 == (cTValue *)0x0) ||
     (pcVar3 = str2num(in_stack_ffffffffffffffa8,(TValue *)0x10f72e), pcVar3 == (cTValue *)0x0)) {
    pcVar2 = lj_meta_lookup((lua_State *)&in_RCX->field_2,(cTValue *)CONCAT44(in_R8D,iVar1),
                            in_stack_ffffffffffffffcc);
    if (((pcVar2->field_2).it == 0xffffffff) &&
       (pcVar2 = lj_meta_lookup((lua_State *)&in_RCX->field_2,(cTValue *)CONCAT44(in_R8D,iVar1),
                                in_stack_ffffffffffffffcc), (pcVar2->field_2).it == 0xffffffff)) {
      str2num(pcVar2,(TValue *)0x10f7bf);
      lj_err_optype(in_RDI,in_RSI,(ErrMsg)((ulong)in_RDX >> 0x20));
    }
    local_8 = mmcall(in_RDI,lj_cont_ra,pcVar2,in_RDX,in_RCX);
  }
  else {
    uVar4 = lj_vm_foldarith(pcVar2->u64,pcVar3->u64,iVar1 + -10);
    in_RSI->u64 = uVar4;
    local_8 = (TValue *)0x0;
  }
  return local_8;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}